

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Cube::setupRightFace(Cube *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = this->x + this->l;
  fVar1 = this->y;
  fVar2 = this->z;
  fVar4 = this->b + fVar2;
  fVar5 = this->h + fVar1;
  this->positionData[0x36] = fVar3;
  this->positionData[0x37] = fVar1;
  this->positionData[0x38] = fVar4;
  this->positionData[0x39] = fVar3;
  this->positionData[0x3a] = fVar1;
  this->positionData[0x3b] = fVar2;
  this->positionData[0x3c] = fVar3;
  this->positionData[0x3d] = fVar5;
  this->positionData[0x3e] = fVar2;
  this->positionData[0x3f] = fVar3;
  this->positionData[0x40] = fVar1;
  this->positionData[0x41] = fVar4;
  this->positionData[0x42] = fVar3;
  this->positionData[0x43] = fVar5;
  this->positionData[0x44] = fVar2;
  this->positionData[0x45] = fVar3;
  this->positionData[0x46] = fVar5;
  this->positionData[0x47] = fVar4;
  return;
}

Assistant:

void setupRightFace() {
        float rightFace[]={

            x+l,y,z+b,
            x+l,y,z,
            x+l,y+h,z,
            x+l,y,z+b,
            x+l,y+h,z,
            x+l,y+h,z+b
        };

        arrayCopy(rightFace,positionData,54);
    }